

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O0

void __thiscall Rectangle::Rectangle(Rectangle *this,Vector *l,Vector *s1,Vector *s2)

{
  double dVar1;
  Vector local_148;
  Vector local_130;
  Vector local_118;
  Vector local_100;
  Vector local_e8;
  Vector local_d0;
  Vector local_b8;
  Vector local_a0;
  double local_88;
  double d;
  double s22;
  double s12;
  double s11;
  Vector local_50;
  Vector *local_28;
  Vector *s2_local;
  Vector *s1_local;
  Vector *l_local;
  Rectangle *this_local;
  
  local_28 = s2;
  s2_local = s1;
  s1_local = l;
  l_local = (Vector *)this;
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__Rectangle_001159a0;
  Vector::Vector(&this->loc);
  Vector::Vector(&this->side1);
  Vector::Vector(&this->side2);
  Vector::Vector(&this->n);
  Vector::Vector(&this->ku);
  Vector::Vector(&this->kv);
  Vector::operator=(&this->loc,s1_local);
  Vector::operator=(&this->side1,s2_local);
  Vector::operator=(&this->side2,local_28);
  operator^((Vector *)&s11,&this->side1,&this->side2);
  normalize(&local_50,(Vector *)&s11);
  Vector::operator=(&this->n,&local_50);
  s12 = operator&(&this->side1,&this->side1);
  s22 = operator&(&this->side1,&this->side2);
  d = operator&(&this->side2,&this->side2);
  local_88 = s12 * d - s22 * d;
  operator*(&local_d0,&this->side1,d);
  operator*(&local_e8,&this->side2,s22);
  operator-(&local_b8,&local_d0,&local_e8);
  operator/(&local_a0,&local_b8,local_88);
  Vector::operator=(&this->ku,&local_a0);
  operator*(&local_130,&this->side2,s12);
  operator*(&local_148,&this->side1,s22);
  operator-(&local_118,&local_130,&local_148);
  operator/(&local_100,&local_118,local_88);
  Vector::operator=(&this->kv,&local_100);
  dVar1 = operator&(&this->loc,&this->ku);
  this->u0 = -dVar1;
  dVar1 = operator&(&this->loc,&this->kv);
  this->v0 = -dVar1;
  return;
}

Assistant:

Rectangle::Rectangle( const Vector& l, const Vector& s1, const Vector& s2  )
{
   loc   = l;
   side1 =  s1;
   side2 =  s2;
   n =   normalize( side1 ^ side2 );

   double s11 = side1 & side1;
   double s12 = side1 & side2;
   double s22 = side2 & side2;
   double d = s11 * s22 - s12 * s22; // determinant

   ku = (side1 * s22 -  side2 *  s12) / d;
   kv = (side2 * s11 -  side1 *  s12) / d;
   u0 = -(loc & ku);
   v0 = -(loc & kv);
}